

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ScalarReplacementPass::CreateVariable
          (ScalarReplacementPass *this,uint32_t type_id,Instruction *var_inst,uint32_t index,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t ty_id;
  uint32_t res_id;
  Instruction *this_00;
  IRContext *pIVar1;
  DefUseManager *this_01;
  Operand *local_118;
  undefined1 local_108 [16];
  Instruction *inst;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_e8;
  BasicBlock *block;
  _func_int **local_d8;
  IRContext *local_d0;
  SmallVector<unsigned_int,_2UL> local_c8;
  Operand local_a0;
  DebugScope local_70;
  _func_int **local_68;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_60;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_48;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> variable;
  uint32_t id;
  uint32_t ptr_id;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *replacements_local;
  uint32_t index_local;
  Instruction *var_inst_local;
  uint32_t type_id_local;
  ScalarReplacementPass *this_local;
  
  ty_id = GetOrCreatePointerType(this,type_id);
  res_id = Pass::TakeNextId((Pass *)this);
  if (res_id == 0) {
    variable._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            )0x0;
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    push_back(replacements,(value_type *)&variable);
  }
  this_00 = (Instruction *)::operator_new(0x70);
  pIVar1 = Pass::context((Pass *)this);
  block._4_4_ = 7;
  local_d8 = (_func_int **)((long)&block + 4);
  local_d0 = (IRContext *)0x1;
  init_list._M_len = 1;
  init_list._M_array = (iterator)local_d8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c8,init_list);
  Operand::Operand(&local_a0,SPV_OPERAND_TYPE_STORAGE_CLASS,&local_c8);
  local_70 = (DebugScope)&local_a0;
  local_68 = (_func_int **)0x1;
  std::allocator<spvtools::opt::Operand>::allocator
            ((allocator<spvtools::opt::Operand> *)((long)&block + 3));
  __l._M_len = (size_type)local_68;
  __l._M_array = (iterator)local_70;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_60,__l,(allocator_type *)((long)&block + 3));
  opt::Instruction::Instruction(this_00,pIVar1,OpVariable,ty_id,res_id,&local_60);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_48,this_00);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_60);
  std::allocator<spvtools::opt::Operand>::~allocator
            ((allocator<spvtools::opt::Operand> *)((long)&block + 3));
  local_118 = (Operand *)&local_70;
  do {
    local_118 = local_118 + -1;
    Operand::~Operand(local_118);
  } while (local_118 != &local_a0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c8);
  pIVar1 = Pass::context((Pass *)this);
  local_e8._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
       IRContext::get_instr_block(pIVar1,var_inst);
  BasicBlock::begin((BasicBlock *)&stack0xffffffffffffff10);
  InstructionList::iterator::InsertBefore
            ((iterator *)&inst,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&stack0xffffffffffffff10);
  BasicBlock::begin((BasicBlock *)local_108);
  local_108._8_8_ =
       utils::IntrusiveList<spvtools::opt::Instruction>::
       iterator_template<spvtools::opt::Instruction>::operator*
                 ((iterator_template<spvtools::opt::Instruction> *)local_108);
  GetOrCreateInitialValue(this,var_inst,index,(Instruction *)local_108._8_8_);
  this_01 = Pass::get_def_use_mgr((Pass *)this);
  analysis::DefUseManager::AnalyzeInstDefUse(this_01,(Instruction *)local_108._8_8_);
  pIVar1 = Pass::context((Pass *)this);
  IRContext::set_instr_block
            (pIVar1,(Instruction *)local_108._8_8_,
             (BasicBlock *)
             local_e8._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
  CopyDecorationsToVariable(this,var_inst,(Instruction *)local_108._8_8_,index);
  opt::Instruction::UpdateDebugInfoFrom((Instruction *)local_108._8_8_,var_inst);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  push_back(replacements,(value_type *)(local_108 + 8));
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_48);
  return;
}

Assistant:

void ScalarReplacementPass::CreateVariable(
    uint32_t type_id, Instruction* var_inst, uint32_t index,
    std::vector<Instruction*>* replacements) {
  uint32_t ptr_id = GetOrCreatePointerType(type_id);
  uint32_t id = TakeNextId();

  if (id == 0) {
    replacements->push_back(nullptr);
  }

  std::unique_ptr<Instruction> variable(
      new Instruction(context(), spv::Op::OpVariable, ptr_id, id,
                      std::initializer_list<Operand>{
                          {SPV_OPERAND_TYPE_STORAGE_CLASS,
                           {uint32_t(spv::StorageClass::Function)}}}));

  BasicBlock* block = context()->get_instr_block(var_inst);
  block->begin().InsertBefore(std::move(variable));
  Instruction* inst = &*block->begin();

  // If varInst was initialized, make sure to initialize its replacement.
  GetOrCreateInitialValue(var_inst, index, inst);
  get_def_use_mgr()->AnalyzeInstDefUse(inst);
  context()->set_instr_block(inst, block);

  CopyDecorationsToVariable(var_inst, inst, index);
  inst->UpdateDebugInfoFrom(var_inst);

  replacements->push_back(inst);
}